

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O3

void __thiscall
Js::WebAssemblyModule::AllocateFunctionExports(WebAssemblyModule *this,uint32 entries)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar1;
  ulong uVar2;
  size_t requestedBytes;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  WasmExport *__s;
  
  uVar2 = (ulong)entries;
  if (entries == 0) {
    __s = (WasmExport *)&DAT_00000008;
  }
  else {
    this_00 = &this->m_alloc->
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00d8e59d;
      *puVar5 = 0;
    }
    requestedBytes = uVar2 * 0x18;
    __s = (WasmExport *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                    (this_00,requestedBytes);
    memset(__s,0,requestedBytes);
    memset(__s + uVar2,0,(requestedBytes + 0xf & 0xfffffffffffffff0) + uVar2 * -0x18);
    if (__s == (WasmExport *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00d8e59d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      __s = (WasmExport *)0x0;
    }
  }
  Memory::Recycler::WBSetBit((char *)&this->m_exports);
  (this->m_exports).ptr = __s;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_exports);
  this->m_exportCount = entries;
  return;
}

Assistant:

void
WebAssemblyModule::AllocateFunctionExports(uint32 entries)
{
    m_exports = AnewArrayZ(m_alloc, Wasm::WasmExport, entries);
    m_exportCount = entries;
}